

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::metric_from_gradients_dim<1>(Omega_h *this,Reals *gradients,Real eps)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_d0;
  undefined1 local_c0 [8];
  type f;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  Write<double> out;
  int n;
  Real eps_local;
  Reals *gradients_local;
  ulong local_10;
  
  if (((ulong)(gradients->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((gradients->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(gradients->write_).shared_alloc_.alloc >> 3;
  }
  size_in = divide_no_remainder<int>((int)(local_10 >> 3),1);
  out.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  Write<double>::Write((Write<double> *)local_60,size_in,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Read<double>::Read((Read<double> *)local_c0,gradients);
  f.gradients.write_.shared_alloc_.direct_ptr = (void *)eps;
  Write<double>::Write((Write<double> *)&f.eps,(Write<double> *)local_60);
  parallel_for<Omega_h::metric_from_gradients_dim<1>(Omega_h::Read<double>,double)::_lambda(int)_1_>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_c0,"metric_from_gradients");
  Write<double>::Write(&local_d0,(Write<signed_char> *)local_60);
  Read<double>::Read((Read<double> *)this,&local_d0);
  Write<double>::~Write(&local_d0);
  metric_from_gradients_dim<1>(Omega_h::Read<double>,double)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_c0);
  Write<double>::~Write((Write<double> *)local_60);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals metric_from_gradients_dim(Reals gradients, Real eps) {
  auto n = divide_no_remainder(gradients.size(), dim);
  auto out = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO const i) {
    auto const grad = get_vector<dim>(gradients, i);
    auto const m = metric_from_gradient(grad, eps);
    set_symm(out, i, m);
  };
  parallel_for(n, f, "metric_from_gradients");
  return out;
}